

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O3

Vec_Int_t * Gia_ManCollectNodesCis(Gia_Man_t *p,int *pNodes,int nNodes)

{
  int iVar1;
  ulong uVar2;
  Vec_Int_t *vNodes;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 10000;
  vNodes->nSize = 0;
  piVar3 = (int *)malloc(40000);
  vNodes->pArray = piVar3;
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (0 < p->nTravIdsAlloc) {
    *p->pTravIds = p->nTravIds;
    if (0 < nNodes) {
      uVar6 = 0;
      do {
        iVar1 = pNodes[uVar6];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar2 = *(ulong *)(p->pObjs + iVar1);
        uVar4 = uVar2 & 0x1fffffff;
        uVar5 = 0;
        if (uVar4 != 0x1fffffff) {
          uVar5 = -uVar4;
        }
        Gia_ManCollectNodesCis_rec(p,p->pObjs + iVar1 + (uVar5 & (long)(int)uVar2 >> 0x1f),vNodes);
        uVar6 = uVar6 + 1;
      } while ((uint)nNodes != uVar6);
    }
    return vNodes;
  }
  __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Vec_Int_t * Gia_ManCollectNodesCis( Gia_Man_t * p, int * pNodes, int nNodes )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i; 
    vNodes = Vec_IntAlloc( 10000 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = Gia_ManObj( p, pNodes[i] );
        if ( Gia_ObjIsCo(pObj) )
            Gia_ManCollectNodesCis_rec( p, Gia_ObjFanin0(pObj), vNodes );
        else
            Gia_ManCollectNodesCis_rec( p, pObj, vNodes );
    }
    return vNodes;
}